

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int firstShiftWithOneBit(word x,int blockSize)

{
  undefined4 local_20;
  int n;
  int blockSize_local;
  word x_local;
  
  local_20 = 0;
  if (blockSize == 0x10) {
    x_local._4_4_ = 0;
  }
  else {
    _n = x;
    if (0xffffffff < x) {
      local_20 = 0x20;
      _n = x >> 0x20;
    }
    if (blockSize == 8) {
      x_local._4_4_ = (0x40 - local_20) / 0x20;
    }
    else {
      if (0xffff < _n) {
        local_20 = local_20 + 0x10;
        _n = _n >> 0x10;
      }
      if (blockSize == 4) {
        x_local._4_4_ = (0x40 - local_20) / 0x10;
      }
      else {
        if (0xff < _n) {
          local_20 = local_20 + 8;
          _n = _n >> 8;
        }
        if (blockSize == 2) {
          x_local._4_4_ = (0x40 - local_20) / 8;
        }
        else {
          if (0xf < _n) {
            local_20 = local_20 + 4;
          }
          x_local._4_4_ = (0x40 - local_20) / 4;
        }
      }
    }
  }
  return x_local._4_4_;
}

Assistant:

int firstShiftWithOneBit(word x, int blockSize)
{
    int n = 0;
    if(blockSize == 16){ return 0;}     
    if (x >= ABC_CONST(0x0000000100000000)) {n = n + 32; x = x >> 32;} 
    if(blockSize == 8){ return (64-n)/32;}  
    if (x >= ABC_CONST(0x0000000000010000)) {n = n + 16; x = x >> 16;} 
    if(blockSize == 4){ return (64-n)/16;}
    if (x >= ABC_CONST(0x0000000000000100)) {n = n + 8; x = x >> 8;}
    if(blockSize == 2){ return (64-n)/8;}
    if (x >= ABC_CONST(0x0000000000000010)) {n = n + 4; x = x >> 4;} 
    return (64-n)/4;    
    
}